

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# common.cc
# Opt level: O3

void sptk::world::InitializeInverseRealFFT(int fft_size,InverseRealFFT *inverse_real_fft)

{
  undefined8 uVar1;
  double *out;
  fft_complex *in;
  long lVar2;
  fft_plan *pfVar3;
  ulong uVar4;
  fft_plan *pfVar5;
  ulong uVar6;
  byte bVar7;
  fft_plan fStack_68;
  
  bVar7 = 0;
  inverse_real_fft->fft_size = fft_size;
  uVar4 = (long)fft_size * 8;
  uVar6 = (long)fft_size << 4;
  if (fft_size < 0) {
    uVar4 = 0xffffffffffffffff;
    uVar6 = 0xffffffffffffffff;
  }
  out = (double *)operator_new__(uVar4);
  inverse_real_fft->waveform = out;
  in = (fft_complex *)operator_new__(uVar6);
  inverse_real_fft->spectrum = in;
  fft_plan_dft_c2r_1d(&fStack_68,fft_size,in,out,3);
  pfVar3 = &fStack_68;
  pfVar5 = &inverse_real_fft->inverse_fft;
  for (lVar2 = 9; lVar2 != 0; lVar2 = lVar2 + -1) {
    uVar1 = *(undefined8 *)pfVar3;
    pfVar5->n = (int)uVar1;
    pfVar5->sign = (int)((ulong)uVar1 >> 0x20);
    pfVar3 = (fft_plan *)((long)pfVar3 + ((ulong)bVar7 * -2 + 1) * 8);
    pfVar5 = (fft_plan *)((long)pfVar5 + (ulong)bVar7 * -0x10 + 8);
  }
  return;
}

Assistant:

void InitializeInverseRealFFT(int fft_size, InverseRealFFT *inverse_real_fft) {
  inverse_real_fft->fft_size = fft_size;
  inverse_real_fft->waveform = new double[fft_size];
  inverse_real_fft->spectrum = new fft_complex[fft_size];
  inverse_real_fft->inverse_fft = fft_plan_dft_c2r_1d(fft_size,
      inverse_real_fft->spectrum, inverse_real_fft->waveform, FFT_ESTIMATE);
}